

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O2

lp_connection_t __thiscall CSocekt::flyd_get_connection(CSocekt *this,int isock)

{
  _List_node_base *p_Var1;
  CMemory *this_00;
  flyd_connection_s *pfVar2;
  MutexLockGuard lock;
  flyd_connection_s *local_28;
  
  lock.mutex_ = &this->m_connectionMutex;
  muduo::MutexLock::lock(lock.mutex_);
  p_Var1 = (this->m_freeconnectionList).
           super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var1 == (_List_node_base *)&this->m_freeconnectionList) {
    this_00 = CMemory::GetInstance();
    pfVar2 = (flyd_connection_s *)CMemory::AllocMemory(this_00,0x120,true);
    flyd_connection_s::flyd_connection_s(pfVar2);
    local_28 = pfVar2;
    flyd_connection_s::GetOneToUse(pfVar2);
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::push_back
              (&this->m_connectionList,&local_28);
    LOCK();
    (this->m_total_connection_n).value_ = (this->m_total_connection_n).value_ + 1;
    UNLOCK();
    pfVar2 = local_28;
  }
  else {
    pfVar2 = (flyd_connection_s *)p_Var1[1]._M_next;
    std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::pop_front
              (&this->m_freeconnectionList);
    flyd_connection_s::GetOneToUse(pfVar2);
    LOCK();
    (this->m_free_connection_n).value_ = (this->m_free_connection_n).value_ + -1;
    UNLOCK();
  }
  pfVar2->fd = isock;
  muduo::MutexLockGuard::~MutexLockGuard(&lock);
  return pfVar2;
}

Assistant:

lp_connection_t CSocekt::flyd_get_connection(int isock)
{
    //因为可能有其他线程要访问m_freeconnectionList，m_connectionList
    //【比如可能有专门的释放线程要释放/或者主线程要释放】之类的，所以应该临界一下
    muduo::MutexLockGuard lock(m_connectionMutex);

     if(!m_freeconnectionList.empty())
    {
        //有空闲的，自然是从空闲的中摘取
        lp_connection_t p_Conn = m_freeconnectionList.front(); //返回第一个元素但不检查元素存在与否
        m_freeconnectionList.pop_front();                         //移除第一个元素但不返回	
        p_Conn->GetOneToUse();
        m_free_connection_n.decrement(); 
        p_Conn->fd = isock;
        return p_Conn;
    }

    //走到这里，表示没空闲的连接了，那就考虑重新创建一个连接
    CMemory *p_memory = CMemory::GetInstance();
    lp_connection_t p_Conn = (lp_connection_t)p_memory->AllocMemory(sizeof(flyd_connection_t),true);
    p_Conn = new(p_Conn) flyd_connection_t();
    p_Conn->GetOneToUse();
    m_connectionList.push_back(p_Conn); //入到总表中来，但不能入到空闲表中来，因为凡是调这个函数的，肯定是要用这个连接的
    m_total_connection_n.increment();             
    p_Conn->fd = isock;
    return p_Conn;

}